

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Start_Resume_R_PDU.cpp
# Opt level: O0

void __thiscall KDIS::PDU::Start_Resume_R_PDU::Encode(Start_Resume_R_PDU *this,KDataStream *stream)

{
  KDataStream *stream_00;
  KDataStream *stream_local;
  Start_Resume_R_PDU *this_local;
  
  Simulation_Management_Header::Encode((Simulation_Management_Header *)this,stream);
  stream_00 = DATA_TYPE::operator<<
                        (stream,&(this->super_Start_Resume_PDU).m_RealWorldTime.super_DataTypeBase);
  DATA_TYPE::operator<<(stream_00,&(this->super_Start_Resume_PDU).m_SimTime.super_DataTypeBase);
  Reliability_Header::Encode(&this->super_Reliability_Header,stream);
  KDataStream::operator<<(stream,(this->super_Start_Resume_PDU).m_ui32RequestID);
  return;
}

Assistant:

void Start_Resume_R_PDU::Encode( KDataStream & stream ) const
{
    Simulation_Management_Header::Encode( stream );

    stream << KDIS_STREAM m_RealWorldTime
           << KDIS_STREAM m_SimTime;

    Reliability_Header::Encode( stream );

    stream << m_ui32RequestID;
}